

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O2

ev_loop * ev_default_loop(uint flags)

{
  if (ev_default_loop_ptr != (ev_loop *)0x0) {
    return ev_default_loop_ptr;
  }
  ev_default_loop_ptr = &default_loop_struct;
  loop_init(&default_loop_struct,flags);
  if (default_loop_struct.backend == 0) {
    ev_default_loop_ptr = (ev_loop *)0x0;
  }
  else {
    childev.pending = 0;
    childev.priority = 2;
    childev.active = 0;
    childev.cb = childcb;
    childev.signum = 0x11;
    ev_signal_start(&default_loop_struct,&childev);
    default_loop_struct.activecnt = default_loop_struct.activecnt + -1;
  }
  return ev_default_loop_ptr;
}

Assistant:

int
#endif
ev_default_loop (unsigned int flags) EV_THROW
{
  if (!ev_default_loop_ptr)
    {
#if EV_MULTIPLICITY
      EV_P = ev_default_loop_ptr = &default_loop_struct;
#else
      ev_default_loop_ptr = 1;
#endif

      loop_init (EV_A_ flags);

      if (ev_backend (EV_A))
        {
#if EV_CHILD_ENABLE
          ev_signal_init (&childev, childcb, SIGCHLD);
          ev_set_priority (&childev, EV_MAXPRI);
          ev_signal_start (EV_A_ &childev);
          ev_unref (EV_A); /* child watcher should not keep loop alive */
#endif
        }
      else
        ev_default_loop_ptr = 0;
    }

  return ev_default_loop_ptr;
}